

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O0

void __thiscall TNT::i_refvec<interval_*>::i_refvec(i_refvec<interval_*> *this,int n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  interval **ppiVar3;
  int *piVar4;
  int n_local;
  i_refvec<interval_*> *this_local;
  
  this->data_ = (interval **)0x0;
  this->ref_count_ = (int *)0x0;
  if (0 < n) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)n;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppiVar3 = (interval **)operator_new__(uVar2);
    this->data_ = ppiVar3;
    piVar4 = (int *)operator_new(4);
    this->ref_count_ = piVar4;
    *this->ref_count_ = 1;
  }
  return;
}

Assistant:

i_refvec<T>::i_refvec(int n) : data_(NULL), ref_count_(NULL)
{
	if (n >= 1)
	{
#ifdef TNT_DEBUG
		std::cout  << "new data storage.\n";
#endif
		data_ = new T[n];
		ref_count_ = new int;
		*ref_count_ = 1;
	}
}